

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall
CUI::DoLabelSelected(CUI *this,CUIRect *pRect,char *pText,bool Selected,float FontSize,int Align)

{
  undefined1 in_CL;
  undefined8 in_RDX;
  char *in_RSI;
  CUI *in_RDI;
  undefined4 in_XMM0_Da;
  CUI *unaff_retaddr;
  vec4 *in_stack_ffffffffffffffc8;
  undefined1 MultiLine;
  undefined3 in_stack_ffffffffffffffe4;
  float LineWidth;
  CUI *pRect_00;
  
  MultiLine = (undefined1)((uint)in_XMM0_Da >> 0x18);
  LineWidth = (float)(CONCAT13(in_CL,in_stack_ffffffffffffffe4) & 0x1ffffff);
  pRect_00 = in_RDI;
  if ((char)((uint)LineWidth >> 0x18) != '\0') {
    TextRender(in_RDI);
    ITextRender::TextColor((ITextRender *)in_RDI,in_stack_ffffffffffffffc8);
    TextRender(in_RDI);
    ITextRender::TextSecondaryColor((ITextRender *)in_RDI,in_stack_ffffffffffffffc8);
  }
  DoLabel(unaff_retaddr,(CUIRect *)pRect_00,in_RSI,(float)((ulong)in_RDX >> 0x20),(int)in_RDX,
          LineWidth,(bool)MultiLine);
  if (((uint)LineWidth & 0x1000000) != 0) {
    TextRender(in_RDI);
    ITextRender::TextColor((ITextRender *)in_RDI,in_stack_ffffffffffffffc8);
    TextRender(in_RDI);
    ITextRender::TextSecondaryColor((ITextRender *)in_RDI,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void CUI::DoLabelSelected(const CUIRect *pRect, const char *pText, bool Selected, float FontSize, int Align)
{
	if(Selected)
	{
		TextRender()->TextColor(CUI::ms_HighlightTextColor);
		TextRender()->TextSecondaryColor(CUI::ms_HighlightTextOutlineColor);
	}
	DoLabel(pRect, pText, FontSize, Align);
	if(Selected)
	{
		TextRender()->TextColor(CUI::ms_DefaultTextColor);
		TextRender()->TextSecondaryColor(CUI::ms_DefaultTextOutlineColor);
	}
}